

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::colSingletons(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  int iVar3;
  int iVar4;
  int p_col;
  int iVar5;
  int *piVar6;
  int *piVar7;
  int *piVar8;
  int *piVar9;
  int *piVar10;
  int *piVar11;
  int *piVar12;
  int *piVar13;
  pointer pnVar14;
  int *piVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  uint *puVar21;
  pointer pnVar22;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar23;
  undefined4 *puVar24;
  int iVar25;
  int *piVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  byte bVar31;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar31 = 0;
  if (0 < (this->temp).stage) {
    piVar6 = (this->row).orig;
    piVar7 = (this->row).perm;
    piVar8 = (this->temp).s_mark;
    lVar18 = 0;
    do {
      iVar3 = piVar6[lVar18];
      lVar27 = (long)(this->u).row.len[iVar3];
      if (0 < lVar27) {
        iVar4 = (this->u).row.start[iVar3];
        piVar9 = (this->u).row.idx;
        lVar30 = 0;
        do {
          p_col = piVar9[iVar4 + lVar30];
          piVar10 = (this->u).col.idx;
          piVar11 = (this->u).col.start;
          piVar12 = (this->u).col.len;
          piVar13 = (this->temp).s_cact;
          iVar25 = (piVar12[p_col] + piVar11[p_col]) - piVar13[p_col];
          piVar15 = piVar10 + iVar25;
          do {
            piVar26 = piVar15;
            piVar15 = piVar26 + 1;
          } while (*piVar26 != iVar3);
          *piVar26 = piVar10[iVar25];
          piVar10[iVar25] = iVar3;
          iVar25 = piVar13[p_col];
          piVar13[p_col] = iVar25 + -1;
          if (iVar25 == 2) {
            iVar25 = piVar12[p_col];
            piVar12[p_col] = iVar25 + -1;
            iVar25 = piVar10[(long)piVar11[p_col] + (long)iVar25 + -1];
            if (-1 < piVar7[iVar25]) goto LAB_00534079;
            piVar10 = (this->u).row.len;
            iVar20 = piVar10[iVar25] + -1;
            iVar5 = (this->u).row.start[iVar25];
            piVar10[iVar25] = iVar20;
            lVar19 = (long)(iVar5 + iVar20);
            lVar17 = lVar19 * 4;
            lVar16 = lVar19 * 0x80 + 0xf8;
            do {
              lVar29 = lVar16;
              lVar28 = lVar17;
              lVar17 = lVar28 + -4;
              lVar16 = lVar29 + -0x80;
            } while (*(int *)((long)(this->u).row.idx + lVar28) != p_col);
            iVar5 = (this->temp).stage;
            puVar1 = (undefined8 *)
                     ((long)(this->u).row.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems +
                     lVar29);
            puVar21 = (uint *)(puVar1 + -0xf);
            pnVar23 = &local_b0;
            for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
              (pnVar23->m_backend).data._M_elems[0] = *puVar21;
              puVar21 = puVar21 + (ulong)bVar31 * -2 + 1;
              pnVar23 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar23 + ((ulong)bVar31 * -2 + 1) * 4);
            }
            local_b0.m_backend.exp = *(int *)(puVar1 + -1);
            local_b0.m_backend.neg = *(bool *)((long)puVar1 + -4);
            local_b0.m_backend._120_8_ = *puVar1;
            setPivot(this,iVar5,p_col,iVar25,&local_b0);
            iVar25 = (this->temp).stage;
            (this->temp).stage = iVar25 + 1;
            piVar8[iVar25] = p_col;
            pnVar14 = (this->u).row.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            puVar2 = (undefined4 *)((long)pnVar14[-2].m_backend.data._M_elems + lVar29 + 8);
            pnVar22 = pnVar14 + lVar19;
            puVar24 = puVar2;
            for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
              *puVar24 = (pnVar22->m_backend).data._M_elems[0];
              pnVar22 = (pointer)((long)pnVar22 + ((ulong)bVar31 * -2 + 1) * 4);
              puVar24 = puVar24 + (ulong)bVar31 * -2 + 1;
            }
            puVar2[0x1c] = pnVar14[lVar19].m_backend.exp;
            *(bool *)(puVar2 + 0x1d) = pnVar14[lVar19].m_backend.neg;
            *(undefined8 *)(puVar2 + 0x1e) = *(undefined8 *)&pnVar14[lVar19].m_backend.fpclass;
            piVar10 = (this->u).row.idx;
            *(int *)((long)piVar10 + lVar28) = piVar10[lVar19];
          }
          else if (iVar25 == 1) {
LAB_00534079:
            this->stat = SINGULAR;
            return;
          }
          lVar30 = lVar30 + 1;
        } while (lVar30 != lVar27);
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 < (this->temp).stage);
  }
  return;
}

Assistant:

void CLUFactor<R>::colSingletons()
{
   int i, j, k, n;
   int len;
   int p_col, p_row, newrow;
   int* idx;
   int* rorig = row.orig;
   int* rperm = row.perm;
   int* sing = temp.s_mark;


   /*  Iteratively update column counts due to removed column singletons
    *  thereby removing new arising columns singletons
    *  and computing the index of the first row singleton (-1)
    *  until no more can be found.
    */

   for(i = 0; i < temp.stage; ++i)
   {
      p_row = rorig[i];
      assert(p_row >= 0);
      idx = &(u.row.idx[u.row.start[p_row]]);
      len = u.row.len[p_row];

      for(j = 0; j < len; ++j)
      {
         /*  Move pivotal nonzeros to front of column.
          */
         p_col = idx[j];
         assert(temp.s_cact[p_col] > 0);

         n = u.col.start[p_col] + u.col.len[p_col] - temp.s_cact[p_col];

         for(k = n; u.col.idx[k] != p_row; ++k)
            ;

         assert(k < u.col.start[p_col] + u.col.len[p_col]);

         u.col.idx[k] = u.col.idx[n];

         u.col.idx[n] = p_row;

         n = --(temp.s_cact[p_col]);          /* column nonzeros of ACTIVE matrix */

         if(n == 1)                   /* Here is another singleton */
         {
            newrow = u.col.idx[--u.col.len[p_col] + u.col.start[p_col]];

            /*      Ensure, matrix not singular
             */

            if(rperm[newrow] >= 0)
            {
               this->stat = SLinSolver<R>::SINGULAR;
               return;
            }

            /*      Find singleton in row.
             */
            n = u.row.start[newrow] + (--(u.row.len[newrow]));

            for(k = n; u.row.idx[k] != p_col; --k)
               ;

            /*      Remove singleton from column.
             */
            setPivot(temp.stage, p_col, newrow, u.row.val[k]);

            sing[temp.stage++] = p_col;

            /*      Move pivot element to diag.
             */
            u.row.val[k] = u.row.val[n];

            u.row.idx[k] = u.row.idx[n];
         }
         else if(n == 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }
      }
   }

   assert(temp.stage <= thedim);
}